

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

deUint32 __thiscall
sglr::ReferenceContext::createProgram(ReferenceContext *this,ShaderProgram *program)

{
  deUint32 dVar1;
  deUint32 name;
  pair<unsigned_int,_sglr::rc::ShaderProgramObjectContainer_*> local_30;
  
  dVar1 = rc::ObjectManager<sglr::rc::ShaderProgramObjectContainer>::allocateName(&this->m_programs)
  ;
  local_30.second = (ShaderProgramObjectContainer *)operator_new(0x20);
  ((local_30.second)->super_NamedObject).m_name = dVar1;
  ((local_30.second)->super_NamedObject).m_refCount = 1;
  ((local_30.second)->super_NamedObject)._vptr_NamedObject =
       (_func_int **)&PTR__ShaderProgramObjectContainer_02188b18;
  (local_30.second)->m_program = program;
  (local_30.second)->m_deleteFlag = false;
  if ((this->m_programs).m_lastName < dVar1) {
    (this->m_programs).m_lastName = dVar1;
  }
  local_30.first = dVar1;
  std::
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,sglr::rc::ShaderProgramObjectContainer*>,std::_Select1st<std::pair<unsigned_int_const,sglr::rc::ShaderProgramObjectContainer*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sglr::rc::ShaderProgramObjectContainer*>>>
  ::_M_emplace_unique<std::pair<unsigned_int,sglr::rc::ShaderProgramObjectContainer*>>
            ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,sglr::rc::ShaderProgramObjectContainer*>,std::_Select1st<std::pair<unsigned_int_const,sglr::rc::ShaderProgramObjectContainer*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sglr::rc::ShaderProgramObjectContainer*>>>
              *)&(this->m_programs).m_objects,&local_30);
  return dVar1;
}

Assistant:

deUint32 ReferenceContext::createProgram (ShaderProgram* program)
{
	int name = m_programs.allocateName();

	m_programs.insert(new rc::ShaderProgramObjectContainer(name, program));

	return name;
}